

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O1

int enet_socket_connect(ENetSocket socket,ENetAddress *address)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  int *piVar4;
  sockaddr_in6 sin;
  sockaddr local_28;
  undefined4 uStack_18;
  undefined4 uStack_14;
  uint local_10;
  
  local_28.sa_data._0_2_ = address->port << 8 | address->port >> 8;
  local_28.sa_family = 10;
  local_28.sa_data._2_4_ = 0;
  uVar1 = *(undefined8 *)&(address->host).__in6_u;
  uVar2 = *(undefined8 *)((long)&(address->host).__in6_u + 8);
  local_28.sa_data._6_4_ = SUB84(uVar1,0);
  local_28.sa_data._10_4_ = SUB84((ulong)uVar1 >> 0x20,0);
  uStack_18 = (undefined4)uVar2;
  uStack_14 = (undefined4)((ulong)uVar2 >> 0x20);
  local_10 = (uint)address->sin6_scope_id;
  iVar3 = connect(socket,&local_28,0x1c);
  if ((iVar3 == -1) && (piVar4 = __errno_location(), *piVar4 == 0x73)) {
    return 0;
  }
  return iVar3;
}

Assistant:

int enet_socket_connect(ENetSocket socket, const ENetAddress *address) {
        struct sockaddr_in6 sin;
        int result;

        memset(&sin, 0, sizeof(struct sockaddr_in6));

        sin.sin6_family     = AF_INET6;
        sin.sin6_port       = ENET_HOST_TO_NET_16(address->port);
        sin.sin6_addr       = address->host;
        sin.sin6_scope_id   = address->sin6_scope_id;

        result = connect(socket, (struct sockaddr *)&sin, sizeof(struct sockaddr_in6));
        if (result == -1 && errno == EINPROGRESS) {
            return 0;
        }

        return result;
    }